

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config-c.cpp
# Opt level: O0

duckdb_state duckdb_create_config(duckdb_config *out_config)

{
  void *pvVar1;
  undefined8 *in_RDI;
  Value *in_stack_00000030;
  string *in_stack_00000038;
  DBConfig *in_stack_00000040;
  DBConfig *config;
  DBConfig *in_stack_000000b0;
  Value *this;
  char *in_stack_ffffffffffffffa8;
  Value *in_stack_ffffffffffffffb0;
  string local_48 [48];
  void *local_18;
  undefined8 *local_10;
  duckdb_state local_4;
  
  if (in_RDI != (undefined8 *)0x0) {
    *in_RDI = 0;
    local_10 = in_RDI;
    pvVar1 = operator_new(0x6a0);
    duckdb::DBConfig::DBConfig(in_stack_000000b0);
    *local_10 = pvVar1;
    this = (Value *)&stack0xffffffffffffffb7;
    local_18 = pvVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"duckdb_api",(allocator *)this);
    duckdb::Value::Value(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    duckdb::DBConfig::SetOptionByName(in_stack_00000040,in_stack_00000038,in_stack_00000030);
    duckdb::Value::~Value(this);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
  }
  local_4 = (duckdb_state)(in_RDI == (undefined8 *)0x0);
  return local_4;
}

Assistant:

duckdb_state duckdb_create_config(duckdb_config *out_config) {
	if (!out_config) {
		return DuckDBError;
	}
	try {
		*out_config = nullptr;
		auto config = new DBConfig();
		*out_config = reinterpret_cast<duckdb_config>(config);
		config->SetOptionByName("duckdb_api", "capi");
	} catch (...) { // LCOV_EXCL_START
		return DuckDBError;
	} // LCOV_EXCL_STOP
	return DuckDBSuccess;
}